

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

Operand __thiscall flow::TargetCodeGenerator::getConstantInt(TargetCodeGenerator *this,Value *value)

{
  ulong uVar1;
  _Map_pointer pppVVar2;
  _Elt_pointer ppVVar3;
  FILE *pFVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long *extraout_RAX;
  Value **ppVVar8;
  Value *unaff_RBX;
  long lVar9;
  ulong uVar10;
  long lVar11;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  long *plStack_290;
  undefined8 uStack_288;
  long alStack_280 [2];
  long alStack_270 [2];
  long *plStack_260;
  undefined8 uStack_258;
  undefined **ppuStack_250;
  undefined1 *puStack_248;
  size_t sStack_240;
  ulong uStack_238;
  undefined1 auStack_230 [504];
  Value *pVStack_38;
  
  pVStack_38 = unaff_RBX;
  if (value != (Value *)0x0) {
    this = (TargetCodeGenerator *)value;
    lVar5 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    pVStack_38 = value;
    if (lVar5 != 0) {
      return *(Operand *)&value[1]._vptr_Value;
    }
  }
  getConstantInt();
  pFVar4 = _stdout;
  pppVVar2 = (this->stack_).
             super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  alStack_270[0] =
       ((long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last -
        (long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur >> 3) +
       ((long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur -
        (long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first >> 3) +
       ((((ulong)((long)pppVVar2 -
                 (long)(this->stack_).
                       super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
       (ulong)(pppVVar2 == (_Map_pointer)0x0)) * 0x40;
  sStack_240 = 0;
  ppuStack_250 = &PTR_grow_0019d320;
  uStack_238 = 500;
  format_str.size_ = 0x20;
  format_str.data_ = "Dump stack state ({} elements):\n";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)alStack_270;
  args.types_ = 5;
  puStack_248 = auStack_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&ppuStack_250,format_str,args);
  fwrite(puStack_248,1,sStack_240,pFVar4);
  ppuStack_250 = &PTR_grow_0019d320;
  if (puStack_248 != auStack_230) {
    operator_delete(puStack_248,uStack_238);
  }
  pppVVar2 = (this->stack_).
             super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  plVar6 = (long *)(((((ulong)((long)pppVVar2 -
                              (long)(this->stack_).
                                    super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(pppVVar2 == (_Map_pointer)0x0)) * 0x40);
  lVar5 = (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_cur -
          (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first >> 3;
  lVar9 = (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_last -
          (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur >> 3;
  if ((long)plVar6 + lVar9 + lVar5 != 0) {
    lVar5 = lVar9 + lVar5 + (long)plVar6;
    lVar11 = 0;
    lVar9 = 0;
    do {
      ppVVar3 = (this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur;
      lVar7 = (long)ppVVar3 -
              (long)(this->stack_).
                    super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_first >> 3;
      uVar1 = lVar9 + lVar7;
      if (uVar1 < 0x40) {
        ppVVar8 = (Value **)((long)ppVVar3 + lVar11);
      }
      else {
        uVar10 = (uVar1 >> 6) + 0xfc00000000000000;
        if (0 < (long)uVar1) {
          uVar10 = uVar1 >> 6;
        }
        ppVVar8 = (this->stack_).
                  super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                  lVar7 + uVar10 * -0x40 + lVar9;
      }
      (*(*ppVVar8)->_vptr_Value[2])(&plStack_290);
      pFVar4 = _stdout;
      plStack_260 = plStack_290;
      uStack_258 = uStack_288;
      sStack_240 = 0;
      ppuStack_250 = &PTR_grow_0019d320;
      uStack_238 = 500;
      format_str_00.size_ = 0xe;
      format_str_00.data_ = "stack[{}]: {}\n";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)alStack_270;
      args_00.types_ = 0xb5;
      alStack_270[0] = lVar9;
      puStack_248 = auStack_230;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&ppuStack_250,format_str_00,args_00);
      fwrite(puStack_248,1,sStack_240,pFVar4);
      ppuStack_250 = &PTR_grow_0019d320;
      if (puStack_248 != auStack_230) {
        operator_delete(puStack_248,uStack_238);
      }
      plVar6 = alStack_280;
      if (plStack_290 != plVar6) {
        operator_delete(plStack_290,alStack_280[0] + 1);
        plVar6 = extraout_RAX;
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar5 != lVar9);
  }
  return (Operand)plVar6;
}

Assistant:

Operand TargetCodeGenerator::getConstantInt(Value* value) {
  FLOW_ASSERT(dynamic_cast<ConstantInt*>(value) != nullptr, "Must be ConstantInt");
  return static_cast<ConstantInt*>(value)->get();
}